

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O2

void __thiscall libcellml::Analyser::AnalyserImpl::AnalyserImpl(AnalyserImpl *this)

{
  GeneratorProfilePtr *this_00;
  _Rb_tree_header *p_Var1;
  GeneratorProfile *pGVar2;
  allocator<char> local_59;
  string local_58;
  
  (this->super_LoggerImpl).mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LoggerImpl).mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LoggerImpl).mMessages.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_LoggerImpl).mIssues.
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LoggerImpl).mMessages.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_LoggerImpl).mMessages.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_LoggerImpl).mWarnings.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_LoggerImpl).mWarnings.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->mAnalyser = (Analyser *)0x0;
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LoggerImpl).mWarnings.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LoggerImpl).mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_dataplus._M_p = (pointer)0x0;
  local_58._M_string_length = 0;
  AnalyserModel::AnalyserModelImpl::create((AnalyserModelImpl *)&this->mModel,(ModelPtr *)&local_58)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_58._M_string_length);
  this_00 = &this->mGeneratorProfile;
  (this->mInternalEquations).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserInternalEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalEquation>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mInternalEquations).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserInternalEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalEquation>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mInternalVariables).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserInternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mInternalVariables).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserInternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mExternalVariables).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mInternalVariables).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserInternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mExternalVariables).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mExternalVariables).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserExternalVariable>,_std::allocator<std::shared_ptr<libcellml::AnalyserExternalVariable>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mInternalEquations).
  super__Vector_base<std::shared_ptr<libcellml::AnalyserInternalEquation>,_std::allocator<std::shared_ptr<libcellml::AnalyserInternalEquation>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GeneratorProfile::create((GeneratorProfile *)this_00,C);
  p_Var1 = &(this->mStandardUnits)._M_t._M_impl.super__Rb_tree_header;
  (this->mStandardUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mStandardUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mStandardUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mStandardUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mStandardUnits)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mCiCnUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mCiCnUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->mCiCnUnits)._M_t._M_impl.super__Rb_tree_header;
  (this->mCiCnUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mCiCnUnits)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mCiCnUnits)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pGVar2 = (this->mGeneratorProfile).
           super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"abs",&local_59);
  GeneratorProfile::setAbsoluteValueString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"ln",&local_59);
  GeneratorProfile::setNaturalLogarithmString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"log",&local_59);
  GeneratorProfile::setCommonLogarithmString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"rem",&local_59);
  GeneratorProfile::setRemString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"arcsin",&local_59);
  GeneratorProfile::setAsinString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"arccos",&local_59);
  GeneratorProfile::setAcosString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"arctan",&local_59);
  GeneratorProfile::setAtanString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"arcsec",&local_59);
  GeneratorProfile::setAsecString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"arccsc",&local_59);
  GeneratorProfile::setAcscString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"arccot",&local_59);
  GeneratorProfile::setAcotString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"arcsinh",&local_59);
  GeneratorProfile::setAsinhString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"arccosh",&local_59);
  GeneratorProfile::setAcoshString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"arctanh",&local_59);
  GeneratorProfile::setAtanhString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"arcsech",&local_59);
  GeneratorProfile::setAsechString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"arccsch",&local_59);
  GeneratorProfile::setAcschString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"arccoth",&local_59);
  GeneratorProfile::setAcothString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"true",&local_59);
  GeneratorProfile::setTrueString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"false",&local_59);
  GeneratorProfile::setFalseString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"exponentiale",&local_59);
  GeneratorProfile::setEString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"pi",&local_59);
  GeneratorProfile::setPiString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"infinity",&local_59);
  GeneratorProfile::setInfString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  pGVar2 = (this_00->super___shared_ptr<libcellml::GeneratorProfile,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"notanumber",&local_59);
  GeneratorProfile::setNanString(pGVar2,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

Analyser::AnalyserImpl::AnalyserImpl()
{
    // Customise our generator's profile.

    mGeneratorProfile->setAbsoluteValueString("abs");
    mGeneratorProfile->setNaturalLogarithmString("ln");
    mGeneratorProfile->setCommonLogarithmString("log");
    mGeneratorProfile->setRemString("rem");
    mGeneratorProfile->setAsinString("arcsin");
    mGeneratorProfile->setAcosString("arccos");
    mGeneratorProfile->setAtanString("arctan");
    mGeneratorProfile->setAsecString("arcsec");
    mGeneratorProfile->setAcscString("arccsc");
    mGeneratorProfile->setAcotString("arccot");
    mGeneratorProfile->setAsinhString("arcsinh");
    mGeneratorProfile->setAcoshString("arccosh");
    mGeneratorProfile->setAtanhString("arctanh");
    mGeneratorProfile->setAsechString("arcsech");
    mGeneratorProfile->setAcschString("arccsch");
    mGeneratorProfile->setAcothString("arccoth");
    mGeneratorProfile->setTrueString("true");
    mGeneratorProfile->setFalseString("false");
    mGeneratorProfile->setEString("exponentiale");
    mGeneratorProfile->setPiString("pi");
    mGeneratorProfile->setInfString("infinity");
    mGeneratorProfile->setNanString("notanumber");
}